

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

RSA * d2i_RSAPublicKey(RSA **a,uchar **in,long len)

{
  uint8_t *puVar1;
  RSA *ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  RSA **out_local;
  
  if (len < 0) {
    out_local = (RSA **)0x0;
  }
  else {
    cbs.len = len;
    CBS_init((CBS *)&ret,*in,len);
    out_local = (RSA **)RSA_parse_public_key((CBS *)&ret);
    if ((RSA *)out_local == (RSA *)0x0) {
      out_local = (RSA **)0x0;
    }
    else {
      if (a != (RSA **)0x0) {
        RSA_free(*a);
        *a = (RSA *)out_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *in = puVar1;
    }
  }
  return (RSA *)out_local;
}

Assistant:

RSA *d2i_RSAPublicKey(RSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  RSA *ret = RSA_parse_public_key(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    RSA_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}